

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O2

bool pstore::command_line::details::
     parse_command_line_options<std::_List_iterator<std::__cxx11::string>,std::__cxx11::ostringstream,std::__cxx11::ostringstream>
               (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                first_arg,
               _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               last_arg,string *overview,
               basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *outs,
               basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *errs)

{
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_arg_00;
  bool bVar1;
  string program_name;
  help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_> help
  ;
  allocator local_1a1;
  name local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  
  first_arg_00._M_node = (first_arg._M_node)->_M_next;
  path::posix::base_name(&local_180,(string *)(first_arg._M_node + 1));
  std::__cxx11::string::string((string *)&local_120,(string *)&local_180);
  std::__cxx11::string::string((string *)&local_140,(string *)overview);
  std::__cxx11::string::string((string *)&local_160,"help",&local_1a1);
  name::name(&local_1a0,&local_160);
  help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help<pstore::command_line::name>(&local_100,&local_120,&local_140,outs,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  parse_option_arguments<std::_List_iterator<std::__cxx11::string>,std::__cxx11::ostringstream>
            ((details *)&local_1a0,first_arg_00,last_arg,&local_180,errs);
  if (local_1a0.name_._M_dataplus._M_p._0_1_ != (string)0x0) {
    bVar1 = parse_positional_arguments<std::_List_iterator<std::__cxx11::string>>
                      ((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_1a0.name_._M_string_length,last_arg);
    if (bVar1) {
      bVar1 = check_for_missing<std::__cxx11::ostringstream>(&local_180,errs);
      goto LAB_001264b2;
    }
  }
  bVar1 = false;
LAB_001264b2:
  help<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~help(&local_100);
  std::__cxx11::string::~string((string *)&local_180);
  return bVar1;
}

Assistant:

bool parse_command_line_options (InputIterator first_arg, InputIterator last_arg,
                                             std::string const & overview, OutputStream & outs,
                                             ErrorStream & errs) {
                std::string const program_name = pstore::path::base_name (*(first_arg++));
                help<OutputStream> const help (program_name, overview, outs, name ("help"));

                bool ok = true;
                std::tie (first_arg, ok) =
                    parse_option_arguments (first_arg, last_arg, program_name, errs);
                if (!ok) {
                    return false;
                }
                if (!parse_positional_arguments (first_arg, last_arg)) {
                    return false;
                }
                return check_for_missing (program_name, errs);
            }